

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstr.cpp
# Opt level: O0

int CVmObjString::getp_compareIgnoreCase(vm_val_t *retval,vm_val_t *self_val,char *str,uint *argc)

{
  int iVar1;
  char *pcVar2;
  vm_val_t *in_RDI;
  size_t olen;
  char *other;
  size_t len;
  size_t in_stack_00000020;
  char *in_stack_00000028;
  vm_val_t *in_stack_ffffffffffffffa8;
  uint *in_stack_ffffffffffffffb0;
  vm_val_t *in_stack_ffffffffffffffb8;
  
  if ((getp_compareIgnoreCase(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)::desc == '\0') &&
     (iVar1 = __cxa_guard_acquire(&getp_compareIgnoreCase(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)
                                   ::desc), iVar1 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&getp_compareIgnoreCase::desc,1);
    __cxa_guard_release(&getp_compareIgnoreCase(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)
                         ::desc);
  }
  iVar1 = CVmObject::get_prop_check_argc
                    (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                     (CVmNativeCodeDesc *)in_stack_ffffffffffffffa8);
  if (iVar1 == 0) {
    vmb_get_len((char *)0x390c92);
    CVmStack::get(0);
    pcVar2 = vm_val_t::get_as_string(in_stack_ffffffffffffffa8);
    if (pcVar2 == (char *)0x0) {
      err_throw(0);
    }
    vmb_get_len((char *)0x390cd7);
    iVar1 = t3_compare_case_fold
                      (in_stack_00000028,in_stack_00000020,(char *)len,(size_t)other,(size_t *)olen)
    ;
    vm_val_t::set_int(in_RDI,iVar1);
    CVmStack::discard(1);
  }
  return 1;
}

Assistant:

int CVmObjString::getp_compareIgnoreCase(VMG_ vm_val_t *retval,
                                         const vm_val_t *self_val,
                                         const char *str, uint *argc)
{
    /* check arguments */
    static CVmNativeCodeDesc desc(1);
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* get the length and buffer pointer */
    size_t len = vmb_get_len(str);
    str += VMB_LEN;

    /* get the other string (leave it on the stack for gc protection) */
    const char *other = G_stk->get(0)->get_as_string(vmg0_);
    if (other == 0)
        err_throw(VMERR_STRING_VAL_REQD);

    /* get its buffer and length */
    size_t olen = vmb_get_len(other);
    other += VMB_LEN;

    /* compare the strings */
    retval->set_int(t3_compare_case_fold(str, len, other, olen, 0));

    /* discard arguments */
    G_stk->discard(1);

    /* done */
    return TRUE;
}